

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O3

TextBasedDMFramework * __thiscall
ASDCP::MXF::TextBasedDMFramework::WriteToTLVSet(TextBasedDMFramework *this,TLVWriter *TLVSet)

{
  MDDEntry *Object;
  MDDEntry *in_RDX;
  TLVWriter local_80;
  
  if (TLVSet[1].super_MemIOWriter.m_p != (byte_t *)0x0) {
    DescriptiveFramework::WriteToTLVSet(&this->super_DescriptiveFramework,TLVSet);
    if ((-1 < *(int *)&(this->super_DescriptiveFramework).super_InterchangeObject.super_KLVPacket.
                       _vptr_KLVPacket) && (*(char *)&TLVSet[3].m_ElementMap._M_t._M_impl == '\x01')
       ) {
      Object = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                MDD_TextBasedDMFramework_ObjectRef);
      TLVWriter::WriteObject(&local_80,in_RDX,(IArchive *)Object);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
      Kumu::Result_t::~Result_t((Result_t *)&local_80);
    }
    return this;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x1266,
                "virtual ASDCP::Result_t ASDCP::MXF::TextBasedDMFramework::WriteToTLVSet(TLVWriter &)"
               );
}

Assistant:

ASDCP::Result_t
TextBasedDMFramework::WriteToTLVSet(TLVWriter& TLVSet)
{
  assert(m_Dict);
  Result_t result = DescriptiveFramework::WriteToTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result)  && ! ObjectRef.empty() ) result = TLVSet.WriteObject(OBJ_WRITE_ARGS_OPT(TextBasedDMFramework, ObjectRef));
  return result;
}